

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

ostream * node::operator<<(ostream *os,BlockfileType *type)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*type == ASSUMED) {
    pcVar3 = "assumed";
    lVar2 = 7;
  }
  else {
    if (*type != NORMAL) {
      std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
      goto LAB_0093a00f;
    }
    pcVar3 = "normal";
    lVar2 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,pcVar3,lVar2);
LAB_0093a00f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return os;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BlockfileType& type) {
    switch(type) {
        case BlockfileType::NORMAL: os << "normal"; break;
        case BlockfileType::ASSUMED: os << "assumed"; break;
        default: os.setstate(std::ios_base::failbit);
    }
    return os;
}